

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O1

size_t __thiscall KrazyMeans::findClosestCentroidIndex(KrazyMeans *this,size_t vec_index)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [64];
  int local_78;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  if (this->iteration < this->scale_threshold_iterations) {
    local_78 = 0x3f800000;
  }
  else {
    auVar1 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,this->iteration - this->scale_threshold_iterations);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)this->scale_factor),auVar1,ZEXT416(0x3f800000));
    local_78 = auVar1._0_4_;
  }
  if ((this->centroids).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->centroids).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar2 = 0;
  }
  else {
    auVar8 = ZEXT464(0x7f800000);
    lVar3 = 0;
    sVar4 = 0;
    sVar2 = 0;
    do {
      fVar6 = auVar8._0_4_;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_60,
                 (vector<float,_std::allocator<float>_> *)
                 ((long)(((this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->vectors).
                        super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                        super__Vector_impl_data._M_start + vec_index * 0x18));
      std::vector<float,_std::allocator<float>_>::vector
                (&local_48,
                 (vector<float,_std::allocator<float>_> *)
                 ((long)&(((this->centroids).
                           super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                           super__Vector_impl_data._M_start)->values).
                         super__Vector_base<float,_std::allocator<float>_>._M_impl + lVar3));
      fVar7 = calculateEuclideanDistance((FeatureVec *)&local_60,(FeatureVec *)&local_48);
      if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar5 = sVar4 == (this->labels).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[vec_index];
      fVar7 = (float)((uint)bVar5 * 0x3f800000 + (uint)!bVar5 * local_78) * fVar7;
      auVar1 = vminss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar6));
      auVar8 = ZEXT1664(auVar1);
      if (fVar7 < fVar6) {
        sVar2 = sVar4;
      }
      sVar4 = sVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (sVar4 < (ulong)(((long)(this->centroids).
                                    super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->centroids).
                                    super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  return sVar2;
}

Assistant:

size_t KrazyMeans::findClosestCentroidIndex(size_t vec_index) {
  float closest = INFINITY;
  size_t index = 0;

  float factor = 1.0f;

  // When we reach the iterations threshold, penalize the distance for any vector switching to another centroid
  // This will cause faster convergence
  if (iteration >= scale_threshold_iterations) {
    factor = 1.0f + (float) (iteration - scale_threshold_iterations) * scale_factor;
  }

  for (size_t c = 0; c < centroids.size(); c++) {
    float dist = calculateEuclideanDistance(data_set->vector(vec_index), centroids[c]);

    // Penalize potential swapping of labels with a factor
    if (labels[vec_index] != c) {
      dist = dist * factor;
    }

    if (dist < closest) {
      closest = dist;
      index = c;
    }
  }
  return index;
}